

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O2

void sm3_speed(void *p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int64_t iVar3;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  uint8_t digest [32];
  uchar msg [8192];
  uint8_t local_2058 [32];
  uint8_t local_2038 [8200];
  
  lVar6 = 100000;
  if (*(long *)((long)p + 8) < 0x4e21) {
    lVar6 = *(long *)((long)p + 8) * 5;
  }
  uVar1 = rdtsc();
  iVar3 = gettime_i64();
  lVar5 = 0;
  if (0 < lVar6) {
    lVar5 = lVar6;
  }
  while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
    SM3_once(local_2038,0x2000,local_2058);
  }
  uVar2 = rdtsc();
  iVar4 = gettime_i64();
  dVar8 = (double)(lVar6 << 0xd) / (double)(iVar4 - iVar3);
  lVar5 = CONCAT44(((int)((ulong)uVar2 >> 0x20) - (int)((ulong)uVar1 >> 0x20)) -
                   (uint)((uint)uVar2 < (uint)uVar1),(uint)uVar2 - (uint)uVar1);
  printf("average cycles per block : %ld \n",lVar5 / (lVar6 << 7),lVar5 % (lVar6 << 7));
  puts("block(B) \t  time(ms)  \t  speed(MB/s)  \t speed(Gb/s) ");
  printf("   %ld     \t  %.4f  \t    %.4f   \t   %.4f \n\n",(double)(iVar4 - iVar3) / 1000.0,dVar8,
         (dVar8 * 8.0) / 1000.0,0x2000);
  return;
}

Assistant:

static void sm3_speed(void *p)
{
    int64_t N;
    double usec;
    double avg_speed_MB, avg_speed_Gb;
    const int64_t block = 8192;

    uint8_t digest[32];
    unsigned char msg[8192];

    TEST_ARGS *args = (TEST_ARGS*)p;
    N = args->N * 5 > 100000 ? 100000 : args->N * 5;

    BENCH_VARS;
    COUNTER_START();
    TIMER_START();

    for (int i = 0; i < N; i++)
        SM3_once(msg, block, digest);

    COUNTER_STOP();
    TIMER_STOP();

    usec = USEC();
    avg_speed_MB = (N * block) / usec;
    avg_speed_Gb = 8 * avg_speed_MB / 1000;

    printf("average cycles per block : %ld \n", (int64_t)(TICKS() / (N * block / 64)));
    printf("block(B) \t  time(ms)  \t  speed(MB/s)  \t speed(Gb/s) \n");
    printf("   %ld     \t  %.4f  \t    %.4f   \t   %.4f \n\n", block, usec/1000, avg_speed_MB, avg_speed_Gb);
}